

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_decoder.cc
# Opt level: O2

void __thiscall
draco::ObjDecoder::MapPointToVertexIndices
          (ObjDecoder *this,PointIndex vert_id,array<int,_3UL> *indices)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  _Head_base<0UL,_draco::PointAttribute_*,_false> _Var4;
  pointer puVar5;
  long lVar6;
  
  iVar2 = indices->_M_elems[0];
  uVar1 = (ulong)vert_id.value_;
  if (iVar2 < 1) {
    if (-1 < iVar2) goto LAB_0010d7e3;
    puVar5 = (this->out_point_cloud_->attributes_).
             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + this->pos_att_id_;
    iVar2 = iVar2 + this->num_positions_;
  }
  else {
    puVar5 = (this->out_point_cloud_->attributes_).
             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + this->pos_att_id_;
    iVar2 = iVar2 + -1;
  }
  *(int *)(*(long *)((long)(puVar5->_M_t).
                           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                           ._M_t + 0x48) + uVar1 * 4) = iVar2;
LAB_0010d7e3:
  lVar6 = (long)this->tex_att_id_;
  if (-1 < lVar6) {
    iVar2 = indices->_M_elems[1];
    if (iVar2 < 1) {
      iVar3 = 0;
      _Var4._M_head_impl =
           *(PointAttribute **)
            &(this->out_point_cloud_->attributes_).
             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar6]._M_t.
             super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
             ._M_t;
      if (iVar2 < 0) {
        iVar3 = iVar2 + this->num_tex_coords_;
      }
    }
    else {
      _Var4._M_head_impl =
           *(PointAttribute **)
            &(this->out_point_cloud_->attributes_).
             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar6]._M_t.
             super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
             ._M_t;
      iVar3 = iVar2 + -1;
    }
    *(int *)(*(long *)&(_Var4._M_head_impl)->indices_map_ + uVar1 * 4) = iVar3;
  }
  lVar6 = (long)this->norm_att_id_;
  if (-1 < lVar6) {
    iVar2 = indices->_M_elems[2];
    if (iVar2 < 1) {
      iVar3 = 0;
      _Var4._M_head_impl =
           *(PointAttribute **)
            &(this->out_point_cloud_->attributes_).
             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar6]._M_t.
             super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
             ._M_t;
      if (iVar2 < 0) {
        iVar3 = iVar2 + this->num_normals_;
      }
    }
    else {
      _Var4._M_head_impl =
           *(PointAttribute **)
            &(this->out_point_cloud_->attributes_).
             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar6]._M_t.
             super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
             ._M_t;
      iVar3 = iVar2 + -1;
    }
    *(int *)(*(long *)&(_Var4._M_head_impl)->indices_map_ + uVar1 * 4) = iVar3;
  }
  if (-1 < (long)this->material_att_id_) {
    *(int *)(*(long *)((long)(this->out_point_cloud_->attributes_).
                             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[this->material_att_id_]._M_t.
                             super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                             ._M_t + 0x48) + uVar1 * 4) = this->last_material_id_;
  }
  if (-1 < (long)this->sub_obj_att_id_) {
    *(int *)(*(long *)((long)(this->out_point_cloud_->attributes_).
                             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[this->sub_obj_att_id_]._M_t.
                             super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                             ._M_t + 0x48) + uVar1 * 4) = this->last_sub_obj_id_;
  }
  return;
}

Assistant:

void ObjDecoder::MapPointToVertexIndices(
    PointIndex vert_id, const std::array<int32_t, 3> &indices) {
  // Use face entries to store mapping between vertex and attribute indices
  // (positions, texture coordinates and normal indices).
  // Any given index is used when indices[x] != 0. For positive values, the
  // point is mapped directly to the specified attribute index. Negative input
  // indices indicate addressing from the last element (e.g. -1 is the last
  // attribute value of a given type, -2 the second last, etc.).
  if (indices[0] > 0) {
    out_point_cloud_->attribute(pos_att_id_)
        ->SetPointMapEntry(vert_id, AttributeValueIndex(indices[0] - 1));
  } else if (indices[0] < 0) {
    out_point_cloud_->attribute(pos_att_id_)
        ->SetPointMapEntry(vert_id,
                           AttributeValueIndex(num_positions_ + indices[0]));
  }

  if (tex_att_id_ >= 0) {
    if (indices[1] > 0) {
      out_point_cloud_->attribute(tex_att_id_)
          ->SetPointMapEntry(vert_id, AttributeValueIndex(indices[1] - 1));
    } else if (indices[1] < 0) {
      out_point_cloud_->attribute(tex_att_id_)
          ->SetPointMapEntry(vert_id,
                             AttributeValueIndex(num_tex_coords_ + indices[1]));
    } else {
      // Texture index not provided but expected. Insert 0 entry as the
      // default value.
      out_point_cloud_->attribute(tex_att_id_)
          ->SetPointMapEntry(vert_id, AttributeValueIndex(0));
    }
  }

  if (norm_att_id_ >= 0) {
    if (indices[2] > 0) {
      out_point_cloud_->attribute(norm_att_id_)
          ->SetPointMapEntry(vert_id, AttributeValueIndex(indices[2] - 1));
    } else if (indices[2] < 0) {
      out_point_cloud_->attribute(norm_att_id_)
          ->SetPointMapEntry(vert_id,
                             AttributeValueIndex(num_normals_ + indices[2]));
    } else {
      // Normal index not provided but expected. Insert 0 entry as the default
      // value.
      out_point_cloud_->attribute(norm_att_id_)
          ->SetPointMapEntry(vert_id, AttributeValueIndex(0));
    }
  }

  // Assign material index to the point if it is available.
  if (material_att_id_ >= 0) {
    out_point_cloud_->attribute(material_att_id_)
        ->SetPointMapEntry(vert_id, AttributeValueIndex(last_material_id_));
  }

  // Assign sub-object index to the point if it is available.
  if (sub_obj_att_id_ >= 0) {
    out_point_cloud_->attribute(sub_obj_att_id_)
        ->SetPointMapEntry(vert_id, AttributeValueIndex(last_sub_obj_id_));
  }
}